

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceGnu-inl.cpp
# Opt level: O0

void __thiscall
cppassert::internal::BackTraceSymbol::setSymbol
          (BackTraceSymbol *this,char *backtrace,char *demangledName,char *offset)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *begin;
  size_t offsetLength;
  size_t nameLength;
  size_t backTraceLength;
  char *offset_local;
  char *demangledName_local;
  char *backtrace_local;
  BackTraceSymbol *this_local;
  
  deallocate(this);
  sVar1 = strlen(backtrace);
  sVar2 = strlen(demangledName);
  sVar3 = strlen(offset);
  pcVar4 = (char *)malloc(sVar1 + sVar2 + sVar3 + 3);
  this->allocated_ = pcVar4;
  if (this->allocated_ != (char *)0x0) {
    pcVar4 = this->allocated_;
    strcpy(this->allocated_,backtrace);
    pcVar4 = pcVar4 + sVar1;
    strcpy(pcVar4,"(");
    pcVar4 = pcVar4 + 1;
    strcpy(pcVar4,demangledName);
    strcpy(pcVar4 + sVar2,"+");
    strcpy(pcVar4 + sVar2 + 1,offset);
    this->symbol_ = this->allocated_;
  }
  return;
}

Assistant:

void setSymbol(const char *backtrace
                    , const char *demangledName
                    , const char *offset)
    {
        deallocate();
        std::size_t backTraceLength = std::strlen(backtrace);
        std::size_t nameLength = std::strlen(demangledName);
        std::size_t offsetLength = std::strlen(offset)+1;
        allocated_ = static_cast<char *>(
                        std::malloc(backTraceLength+nameLength+offsetLength+2));
        if(!allocated_)
        {
            return;
        }
        char *begin = allocated_;
        std::strcpy(allocated_, backtrace);
        begin += backTraceLength;
        std::strcpy(begin, "(");
        begin += 1;
        std::strcpy(begin, demangledName);
        begin += nameLength;
        std::strcpy(begin, "+");
        begin += 1;
        std::strcpy(begin, offset);
        symbol_ = allocated_;
    }